

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_extension.cpp
# Opt level: O3

optional_idx
duckdb::ParquetMultiFileInfo::MaxThreads
          (MultiFileBindData *bind_data_p,MultiFileGlobalState *global_state,
          FileExpandResult expand_result)

{
  pointer pTVar1;
  optional_idx oVar2;
  undefined3 in_register_00000011;
  optional_idx local_10;
  
  oVar2.index = 0xffffffffffffffff;
  if (CONCAT31(in_register_00000011,expand_result) != 2) {
    pTVar1 = unique_ptr<duckdb::TableFunctionData,_std::default_delete<duckdb::TableFunctionData>,_true>
             ::operator->(&bind_data_p->bind_data);
    optional_idx::optional_idx
              (&local_10,*(long *)(pTVar1 + 0x28) + (ulong)(*(long *)(pTVar1 + 0x28) == 0));
    oVar2.index = local_10.index;
  }
  return (optional_idx)oVar2.index;
}

Assistant:

optional_idx ParquetMultiFileInfo::MaxThreads(const MultiFileBindData &bind_data_p,
                                              const MultiFileGlobalState &global_state,
                                              FileExpandResult expand_result) {
	if (expand_result == FileExpandResult::MULTIPLE_FILES) {
		// always launch max threads if we are reading multiple files
		return optional_idx();
	}
	auto &bind_data = bind_data_p.bind_data->Cast<ParquetReadBindData>();
	return MaxValue(bind_data.initial_file_row_groups, static_cast<idx_t>(1));
}